

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,qint64 key)

{
  QCborValue *array;
  int iVar1;
  QCborContainerPrivate *pQVar3;
  qsizetype qVar4;
  QCborValueConstRef QVar5;
  QCborContainerPrivate *pQVar2;
  
  iVar1 = *(int *)(this + 0x10);
  array = this + 8;
  pQVar3 = *(QCborContainerPrivate **)(this + 8);
  if (key < 0 || iVar1 != 0x80) {
LAB_002e7d9d:
    if (iVar1 != 0xa0) {
      if (iVar1 == 0x80) {
        convertArrayToMap((QCborContainerPrivate **)array);
      }
      else {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        *(undefined4 *)(this + 0x10) = 0xa0;
        if (pQVar3 != (QCborContainerPrivate *)0x0) {
          QCborContainerPrivate::deref(pQVar3);
        }
      }
    }
    *(undefined4 *)(this + 0x10) = 0xa0;
    *(undefined8 *)this = 0xffffffffffffffff;
    QVar5 = (QCborValueConstRef)
            QCborContainerPrivate::findOrAddMapKey<long_long>
                      (*(QCborContainerPrivate **)(this + 8),key);
    pQVar2 = QVar5.d;
    pQVar3 = *(QCborContainerPrivate **)(this + 8);
    if (pQVar3 != pQVar2) {
      if (pQVar3 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQVar3);
      }
      if (pQVar2 != (QCborContainerPrivate *)0x0) {
        LOCK();
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(QCborContainerPrivate **)array = pQVar2;
    }
  }
  else {
    if (0xffff < key) {
      if (pQVar3 == (QCborContainerPrivate *)0x0) {
        qVar4 = 0;
      }
      else {
        qVar4 = (pQVar3->elements).d.size;
      }
      if (qVar4 < key) goto LAB_002e7d9d;
    }
    pQVar3 = maybeGrow(pQVar3,key);
    QVar5.i = key;
    QVar5.d = pQVar3;
    *(QCborContainerPrivate **)array = pQVar3;
  }
  return (QCborValueRef)QVar5;
}

Assistant:

QCborValueRef QCborValue::operator[](qint64 key)
{
    if (shouldArrayRemainArray(key, t, container)) {
        container = maybeGrow(container, key);
        return { container, qsizetype(key) };
    }
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}